

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::CustomOptions_OptionLocations_Test::TestBody
          (CustomOptions_OptionLocations_Test *this)

{
  FileDescriptor *this_00;
  int32_t iVar1;
  int iVar2;
  uint uVar3;
  CppStringType CVar4;
  Descriptor *this_01;
  OneofDescriptor *pOVar5;
  EnumDescriptor *pEVar6;
  undefined8 extraout_RAX;
  char *pcVar7;
  char *in_R9;
  pointer *__ptr;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  Metadata MVar8;
  AssertionResult gtest_ar;
  AssertHelper local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  FieldDescriptor *local_58;
  AssertHelper local_50;
  MethodDescriptor *local_48;
  ServiceDescriptor *local_40;
  FieldDescriptor *local_38;
  
  MVar8 = proto2_unittest::TestMessageWithCustomOptions::GetMetadata
                    ((TestMessageWithCustomOptions *)
                     proto2_unittest::_TestMessageWithCustomOptions_default_instance_);
  this_01 = MVar8.descriptor;
  this_00 = this_01->file_;
  name._M_str = "field1";
  name._M_len = 6;
  local_58 = Descriptor::FindFieldByName(this_01,name);
  name_00._M_str = "AnOneof";
  name_00._M_len = 7;
  pOVar5 = Descriptor::FindOneofByName(this_01,name_00);
  name_01._M_str = "map_field";
  name_01._M_len = 9;
  local_38 = Descriptor::FindFieldByName(this_01,name_01);
  name_02._M_str = "AnEnum";
  name_02._M_len = 6;
  pEVar6 = Descriptor::FindEnumTypeByName(this_01,name_02);
  name_03._M_str = "TestServiceWithCustomOptions";
  name_03._M_len = 0x1c;
  local_40 = FileDescriptor::FindServiceByName(this_00,name_03);
  name_04._M_str = "Foo";
  name_04._M_len = 3;
  local_48 = ServiceDescriptor::FindMethodByName(local_40,name_04);
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_24cb016ea;
  local_90.data_ =
       (AssertHelperData *)
       protobuf::internal::ExtensionSet::GetUInt64
                 (&(this_00->options_->field_0)._impl_._extensions_,proto2_unittest::file_opt1,
                  DAT_019478b8);
  testing::internal::CmpHelperEQ<long,unsigned_long>
            ((internal *)local_78,"int64_t{9876543210}",
             "file->options().GetExtension(proto2_unittest::file_opt1)",(long *)&local_88,
             (unsigned_long *)&local_90);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf1b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_88._M_head_impl._0_4_ = 0xffffffc8;
  iVar1 = protobuf::internal::ExtensionSet::GetInt32
                    (&(this_01->options_->field_0)._impl_._extensions_,proto2_unittest::message_opt1
                     ,DAT_019478c4);
  local_90.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_78,"-56",
             "message->options().GetExtension(proto2_unittest::message_opt1)",(int *)&local_88,
             (int *)&local_90);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf1d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_20a75e12d;
  local_90.data_ =
       (AssertHelperData *)
       protobuf::internal::ExtensionSet::GetUInt64
                 (&(local_58->options_->field_0)._impl_._extensions_,proto2_unittest::field_opt1,
                  DAT_019478d0);
  testing::internal::CmpHelperEQ<long,unsigned_long>
            ((internal *)local_78,"int64_t{8765432109}",
             "field->options().GetExtension(proto2_unittest::field_opt1)",(long *)&local_88,
             (unsigned_long *)&local_90);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf1f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_88._M_head_impl._0_4_ = 0x2a;
  iVar1 = protobuf::internal::ExtensionSet::GetInt32
                    (&(local_58->options_->field_0)._impl_._extensions_,proto2_unittest::field_opt2,
                     DAT_019478dc);
  local_90.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_78,"42","field->options().GetExtension(proto2_unittest::field_opt2)",
             (int *)&local_88,(int *)&local_90);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf21,pcVar7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_88._M_head_impl._0_4_ = 0xffffff9d;
  iVar1 = protobuf::internal::ExtensionSet::GetInt32
                    (&(pOVar5->options_->field_0)._impl_._extensions_,proto2_unittest::oneof_opt1,
                     DAT_019478e4);
  local_90.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_78,"-99","oneof->options().GetExtension(proto2_unittest::oneof_opt1)"
             ,(int *)&local_88,(int *)&local_90);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf22,pcVar7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00003039;
  local_90.data_ =
       (AssertHelperData *)
       protobuf::internal::ExtensionSet::GetUInt64
                 (&(local_38->options_->field_0)._impl_._extensions_,proto2_unittest::field_opt1,
                  DAT_019478d0);
  testing::internal::CmpHelperEQ<long,unsigned_long>
            ((internal *)local_78,"int64_t{12345}",
             "map_field->options().GetExtension(proto2_unittest::field_opt1)",(long *)&local_88,
             (unsigned_long *)&local_90);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf24,pcVar7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_88._M_head_impl._0_4_ = 0xfffffceb;
  iVar1 = protobuf::internal::ExtensionSet::GetInt32
                    (&(pEVar6->options_->field_0)._impl_._extensions_,proto2_unittest::enum_opt1,
                     DAT_019478ec);
  local_90.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_78,"-789","enm->options().GetExtension(proto2_unittest::enum_opt1)",
             (int *)&local_88,(int *)&local_90);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar7 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xf25,pcVar7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_90.data_._0_4_ = 0x7b;
  if (1 < pEVar6->value_count_) {
    local_78._0_4_ =
         protobuf::internal::ExtensionSet::GetInt32
                   (&((pEVar6->values_[1].options_)->field_0)._impl_._extensions_,
                    proto2_unittest::enum_value_opt1,DAT_019478f4);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_88,"123",
               "enm->value(1)->options().GetExtension( proto2_unittest::enum_value_opt1)",
               (int *)&local_90,(int *)local_78);
    if (local_88._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_78);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar7 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xf27,pcVar7);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_78._4_4_,local_78._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_78._4_4_,local_78._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_fffffffdb34fe916;
    local_90.data_ =
         (AssertHelperData *)
         protobuf::internal::ExtensionSet::GetInt64
                   (&(local_40->options_->field_0)._impl_._extensions_,proto2_unittest::service_opt1
                    ,DAT_01947900);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)local_78,"int64_t{-9876543210}",
               "service->options().GetExtension(proto2_unittest::service_opt1)",(long *)&local_88,
               (long *)&local_90);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar7 = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xf29,pcVar7);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    local_88._M_head_impl._0_4_ = 2;
    iVar2 = protobuf::internal::ExtensionSet::GetEnum
                      (&(local_48->options_->field_0)._impl_._extensions_,
                       proto2_unittest::method_opt1,DAT_0194790c);
    local_90.data_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<proto2_unittest::MethodOpt1,proto2_unittest::MethodOpt1>
              ((internal *)local_78,"proto2_unittest::METHODOPT1_VAL2",
               "method->options().GetExtension(proto2_unittest::method_opt1)",
               (MethodOpt1 *)&local_88,(MethodOpt1 *)&local_90);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar7 = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xf2b,pcVar7);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    uVar3 = (this_01->options_->field_0)._impl_._has_bits_.has_bits_[0] & 2;
    local_88._M_head_impl._0_1_ = (internal)(char)(uVar3 >> 1);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (uVar3 == 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)&local_88,
                 (AssertionResult *)"message->options().has_message_set_wire_format()","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xf2e,(char *)CONCAT44(local_78._4_4_,local_78._0_4_));
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._4_4_,local_78._0_4_) != &local_68) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_78._4_4_,local_78._0_4_),
                        local_68._M_allocated_capacity + 1);
      }
      if (local_90.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
    }
    CVar4 = FieldDescriptor::cpp_string_type(local_58);
    local_88._M_head_impl._0_4_ = CVar4;
    local_90.data_._0_4_ = 3;
    testing::internal::
    CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::CppStringType,google::protobuf::internal::FieldDescriptorLite::CppStringType>
              ((internal *)local_78,"field->cpp_string_type()",
               "FieldDescriptor::CppStringType::kString",(CppStringType *)&local_88,
               (CppStringType *)&local_90);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar7 = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xf2f,pcVar7);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (local_88._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    return;
  }
  TestBody();
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if (local_88._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_88._M_head_impl + 8))();
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(CustomOptions, OptionLocations) {
  const Descriptor* message =
      proto2_unittest::TestMessageWithCustomOptions::descriptor();
  const FileDescriptor* file = message->file();
  const FieldDescriptor* field = message->FindFieldByName("field1");
  const OneofDescriptor* oneof = message->FindOneofByName("AnOneof");
  const FieldDescriptor* map_field = message->FindFieldByName("map_field");
  const EnumDescriptor* enm = message->FindEnumTypeByName("AnEnum");
  // TODO: Support EnumValue options, once the compiler does.
  const ServiceDescriptor* service =
      file->FindServiceByName("TestServiceWithCustomOptions");
  const MethodDescriptor* method = service->FindMethodByName("Foo");

  EXPECT_EQ(int64_t{9876543210},
            file->options().GetExtension(proto2_unittest::file_opt1));
  EXPECT_EQ(-56,
            message->options().GetExtension(proto2_unittest::message_opt1));
  EXPECT_EQ(int64_t{8765432109},
            field->options().GetExtension(proto2_unittest::field_opt1));
  EXPECT_EQ(42,  // Check that we get the default for an option we don't set.
            field->options().GetExtension(proto2_unittest::field_opt2));
  EXPECT_EQ(-99, oneof->options().GetExtension(proto2_unittest::oneof_opt1));
  EXPECT_EQ(int64_t{12345},
            map_field->options().GetExtension(proto2_unittest::field_opt1));
  EXPECT_EQ(-789, enm->options().GetExtension(proto2_unittest::enum_opt1));
  EXPECT_EQ(123, enm->value(1)->options().GetExtension(
                     proto2_unittest::enum_value_opt1));
  EXPECT_EQ(int64_t{-9876543210},
            service->options().GetExtension(proto2_unittest::service_opt1));
  EXPECT_EQ(proto2_unittest::METHODOPT1_VAL2,
            method->options().GetExtension(proto2_unittest::method_opt1));

  // See that the regular options went through unscathed.
  EXPECT_TRUE(message->options().has_message_set_wire_format());
  EXPECT_EQ(field->cpp_string_type(), FieldDescriptor::CppStringType::kString);
}